

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genProductString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,
          dyn_bitset *contributingViews,prod_bitset *product)

{
  string *psVar1;
  long lVar2;
  undefined8 uVar3;
  Attribute *pAVar4;
  long *plVar5;
  size_t sVar6;
  View *pVVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  CppGenerator *pCVar14;
  pointer f_id;
  ulong attID;
  long lVar15;
  ulong v_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string freeVarString;
  CppGenerator *local_e8;
  undefined1 local_d8 [88];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  pointer local_40;
  dyn_bitset *local_38;
  
  local_d8._24_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d8._24_8_;
  local_d8._16_8_ = __return_storage_ptr__;
  local_d8._64_8_ = product;
  local_38 = contributingViews;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  f_id = (pointer)0x0;
  local_d8._72_8_ = node;
LAB_0024afbe:
  if ((*(ulong *)(local_d8._64_8_ + ((ulong)f_id >> 6) * 8) >> ((ulong)f_id & 0x3f) & 1) != 0) {
    local_d8._80_8_ =
         QueryCompiler::getFunction
                   ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    ,(size_t)f_id);
    local_60._0_8_ = local_60 + 0x10;
    pCVar14 = (CppGenerator *)0x2a1d5a;
    local_40 = f_id;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60);
    attID = 0;
LAB_0024b01b:
    uVar13 = attID >> 6;
    uVar12 = 1L << ((byte)attID & 0x3f);
    if (((((var_bitset *)local_d8._80_8_)->super__Base_bitset<2UL>)._M_w[uVar13] >> (attID & 0x3f) &
        1) != 0) {
      if ((*(ulong *)(local_d8._72_8_ + uVar13 * 8 + 0x50) & uVar12) == 0) {
        lVar15 = 8;
        v_id = 0;
        do {
          sVar6 = QueryCompiler::numberOfViews
                            ((this->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (sVar6 <= v_id) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"The loop hasn\'t been found - THIS IS A MISTAKE\n",
                       0x2f);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)local_d8._72_8_,
                                *(size_type *)(local_d8._72_8_ + 8));
            std::endl<char,std::char_traits<char>>(poVar9);
            pbVar10 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                      (bitset<1500UL> *)local_d8._64_8_);
            std::endl<char,std::char_traits<char>>(pbVar10);
            pAVar4 = TreeDecomposition::getAttribute
                               ((this->_td).
                                super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,attID);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(pAVar4->_name)._M_dataplus._M_p,
                                (pAVar4->_name)._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar9);
            exit(1);
          }
          if (((local_38->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[v_id >> 6] >> (v_id & 0x3f) & 1) != 0) {
            pVVar7 = QueryCompiler::getView
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                ,v_id);
            if (((pVVar7->_fVars).super__Base_bitset<2UL>._M_w[uVar13] & uVar12) != 0)
            goto LAB_0024b110;
          }
          v_id = v_id + 1;
          lVar15 = lVar15 + 0x20;
        } while( true );
      }
      psVar1 = (string *)(local_d8 + 0x58);
      local_80._M_allocated_capacity = (size_type)(local_d8 + 0x68);
      std::__cxx11::string::_M_construct<char*>
                (psVar1,*(long *)local_d8._72_8_,
                 *(size_type *)(local_d8._72_8_ + 8) + *(long *)local_d8._72_8_);
      std::__cxx11::string::append((char *)psVar1);
      pAVar4 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          attID);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)psVar1,(ulong)(pAVar4->_name)._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar11) {
        local_d8._48_8_ = *psVar11;
        local_d8._56_8_ = plVar5[3];
        local_d8._32_8_ = local_d8 + 0x30;
      }
      else {
        local_d8._48_8_ = *psVar11;
        local_d8._32_8_ = (size_type *)*plVar5;
      }
      local_e8 = (CppGenerator *)local_d8;
      local_d8._40_8_ = plVar5[1];
      *plVar5 = (long)psVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_d8 + 0x20);
      pCVar14 = (CppGenerator *)(plVar5 + 2);
      if ((CppGenerator *)*plVar5 == pCVar14) {
        local_d8._0_8_ = (pCVar14->super_CodeGenerator)._vptr_CodeGenerator;
        local_d8._8_8_ = plVar5[3];
      }
      else {
        local_d8._0_8_ = (pCVar14->super_CodeGenerator)._vptr_CodeGenerator;
        local_e8 = (CppGenerator *)*plVar5;
      }
      *plVar5 = (long)pCVar14;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pCVar14 = local_e8;
      std::__cxx11::string::_M_append(local_60,(ulong)local_e8);
      goto LAB_0024b2b1;
    }
    goto LAB_0024b2dd;
  }
  goto LAB_0024b3b6;
LAB_0024b110:
  local_80._M_allocated_capacity = (size_type)(local_d8 + 0x68);
  lVar2 = *(long *)((long)this->viewName + lVar15 + -8);
  psVar1 = (string *)(local_d8 + 0x58);
  std::__cxx11::string::_M_construct<char*>
            (psVar1,lVar2,*(long *)((long)&(this->viewName->_M_dataplus)._M_p + lVar15) + lVar2);
  std::__cxx11::string::append((char *)psVar1);
  pAVar4 = TreeDecomposition::getAttribute
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,attID);
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)psVar1,(ulong)(pAVar4->_name)._M_dataplus._M_p);
  local_d8._32_8_ = local_d8 + 0x30;
  psVar11 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar11) {
    local_d8._48_8_ = *psVar11;
    local_d8._56_8_ = puVar8[3];
  }
  else {
    local_d8._48_8_ = *psVar11;
    local_d8._32_8_ = (size_type *)*puVar8;
  }
  local_e8 = (CppGenerator *)local_d8;
  local_d8._40_8_ = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_d8 + 0x20);
  pCVar14 = (CppGenerator *)(plVar5 + 2);
  if ((CppGenerator *)*plVar5 == pCVar14) {
    local_d8._0_8_ = (pCVar14->super_CodeGenerator)._vptr_CodeGenerator;
    local_d8._8_8_ = plVar5[3];
  }
  else {
    local_d8._0_8_ = (pCVar14->super_CodeGenerator)._vptr_CodeGenerator;
    local_e8 = (CppGenerator *)*plVar5;
  }
  *plVar5 = (long)pCVar14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pCVar14 = local_e8;
  std::__cxx11::string::_M_append(local_60,(ulong)local_e8);
LAB_0024b2b1:
  if (local_e8 != (CppGenerator *)local_d8) {
    operator_delete(local_e8);
  }
  if ((undefined1 *)local_d8._32_8_ != local_d8 + 0x30) {
    operator_delete((void *)local_d8._32_8_);
  }
  if ((undefined1 *)local_80._M_allocated_capacity != local_d8 + 0x68) {
    operator_delete((void *)local_80._M_allocated_capacity);
  }
LAB_0024b2dd:
  attID = attID + 1;
  if (attID == 100) goto code_r0x0024b2ea;
  goto LAB_0024b01b;
code_r0x0024b2ea:
  std::__cxx11::string::pop_back();
  getFunctionString((string *)(local_d8 + 0x20),pCVar14,(Function *)local_d8._80_8_,
                    (string *)local_60);
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)(local_d8 + 0x20));
  plVar5 = puVar8 + 2;
  if ((long *)*puVar8 == plVar5) {
    local_d8._0_8_ = *plVar5;
    local_d8._8_8_ = puVar8[3];
    local_e8 = (CppGenerator *)local_d8;
  }
  else {
    local_d8._0_8_ = *plVar5;
    local_e8 = (CppGenerator *)*puVar8;
  }
  *puVar8 = plVar5;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_d8._16_8_,(ulong)local_e8);
  if (local_e8 != (CppGenerator *)local_d8) {
    operator_delete(local_e8);
  }
  f_id = local_40;
  if ((undefined1 *)local_d8._32_8_ != local_d8 + 0x30) {
    operator_delete((void *)local_d8._32_8_);
  }
  if ((element_type *)local_60._0_8_ != (element_type *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_);
  }
LAB_0024b3b6:
  uVar3 = local_d8._16_8_;
  f_id = (pointer)((long)(f_id->super__Base_bitset<2UL>)._M_w + 1);
  if (f_id == (pointer)0x5dc) {
    if (*(size_type *)(local_d8._16_8_ + 8) == 0) {
      std::__cxx11::string::append((char *)local_d8._16_8_);
    }
    else {
      std::__cxx11::string::pop_back();
    }
    return (string *)uVar3;
  }
  goto LAB_0024afbe;
}

Assistant:

std::string CppGenerator::genProductString(
    const TDNode& node, const dyn_bitset& contributingViews, const prod_bitset& product)
{
    std::string productString = "";
    // Turn each function into string
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (product[f])
        {
            Function* function = _qc->getFunction(f);
            const var_bitset& functionVars = function->_fVars;

            std::string freeVarString = "";

            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {                        
                if (functionVars[v])
                {
                    if (node._bag[v])
                    {
                        freeVarString += node._name+"Tuple."+
                            _td->getAttribute(v)->_name+",";                            
                    }
                    else
                    {
                        bool notFound = true;
                        for (size_t incViewID = 0; incViewID <
                                 _qc->numberOfViews(); ++incViewID)
                        {
                            if (contributingViews[incViewID])
                            {
                                View* incView = _qc->getView(incViewID);

                                if (incView->_fVars[v])
                                {
                                    freeVarString += viewName[incViewID]+"Tuple."+
                                        _td->getAttribute(v)->_name+",";
                                    notFound = false;
                                    break;
                                }                  
                            }
                        }

                        if (notFound)
                        {
                            ERROR("The loop hasn't been found - THIS IS A MISTAKE\n");
                            std::cout << node._name << std::endl;
                            std::cout << product << std::endl;
                            std::cout << _td->getAttribute(v)->_name << std::endl;
                            exit(1);
                        }
                    }
                }
            }

            freeVarString.pop_back();
            productString += getFunctionString(function,freeVarString)+"*";
        }
    }
            
    if (!productString.empty())
        productString.pop_back();
    else
        productString += "1";
    
    return productString;    
}